

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O1

vector<YAML::Node,_std::allocator<YAML::Node>_> *
YAML::LoadAll(vector<YAML::Node,_std::allocator<YAML::Node>_> *__return_storage_ptr__,istream *input
             )

{
  bool bVar1;
  Parser parser;
  NodeBuilder builder;
  Parser local_f0;
  Node local_e0;
  NodeBuilder local_a0;
  
  (__return_storage_ptr__->super__Vector_base<YAML::Node,_std::allocator<YAML::Node>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<YAML::Node,_std::allocator<YAML::Node>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<YAML::Node,_std::allocator<YAML::Node>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Parser::Parser(&local_f0,input);
  do {
    NodeBuilder::NodeBuilder(&local_a0);
    bVar1 = Parser::HandleNextDocument(&local_f0,&local_a0.super_EventHandler);
    if (!bVar1) {
      NodeBuilder::~NodeBuilder(&local_a0);
      break;
    }
    NodeBuilder::Root(&local_e0,&local_a0);
    std::vector<YAML::Node,_std::allocator<YAML::Node>_>::emplace_back<YAML::Node>
              (__return_storage_ptr__,&local_e0);
    if (local_e0.m_pMemory.
        super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e0.m_pMemory.
                 super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0.m_invalidKey._M_dataplus._M_p != &local_e0.m_invalidKey.field_2) {
      operator_delete(local_e0.m_invalidKey._M_dataplus._M_p);
    }
    NodeBuilder::~NodeBuilder(&local_a0);
  } while (bVar1);
  Parser::~Parser(&local_f0);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Node> LoadAll(std::istream& input) {
  std::vector<Node> docs;

  Parser parser(input);
  while (true) {
    NodeBuilder builder;
    if (!parser.HandleNextDocument(builder)) {
      break;
    }
    docs.push_back(builder.Root());
  }

  return docs;
}